

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void FindFollowSets(lemon *lemp)

{
  config *pcVar1;
  plink *ppVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  config **ppcVar9;
  plink **pppVar10;
  long lVar11;
  
  uVar5 = lemp->nstate;
  uVar7 = 0;
  uVar8 = 0;
  if (0 < (int)uVar5) {
    uVar8 = (ulong)uVar5;
  }
  for (; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    ppcVar9 = &lemp->sorted[uVar7]->cfp;
    while (pcVar1 = *ppcVar9, pcVar1 != (config *)0x0) {
      pcVar1->status = INCOMPLETE;
      ppcVar9 = &pcVar1->next;
    }
  }
  lVar11 = 0;
  bVar3 = false;
  do {
    while ((int)uVar5 <= lVar11) {
      lVar11 = 0;
      bVar4 = !bVar3;
      bVar3 = false;
      if (bVar4) {
        return;
      }
    }
    ppcVar9 = &lemp->sorted[lVar11]->cfp;
    while (pcVar1 = *ppcVar9, pcVar1 != (config *)0x0) {
      if (pcVar1->status != COMPLETE) {
        pppVar10 = &pcVar1->fplp;
        while (ppVar2 = *pppVar10, ppVar2 != (plink *)0x0) {
          iVar6 = SetUnion(ppVar2->cfp->fws,pcVar1->fws);
          if (iVar6 != 0) {
            ppVar2->cfp->status = INCOMPLETE;
            bVar3 = true;
          }
          pppVar10 = &ppVar2->next;
        }
        pcVar1->status = COMPLETE;
      }
      ppcVar9 = &pcVar1->next;
    }
    lVar11 = lVar11 + 1;
    uVar5 = lemp->nstate;
  } while( true );
}

Assistant:

void FindFollowSets(struct lemon *lemp)
{
  int i;
  struct config *cfp;
  struct plink *plp;
  int progress;
  int change;

  for(i=0; i<lemp->nstate; i++){
    for(cfp=lemp->sorted[i]->cfp; cfp; cfp=cfp->next){
      cfp->status = INCOMPLETE;
    }
  }
  
  do{
    progress = 0;
    for(i=0; i<lemp->nstate; i++){
      for(cfp=lemp->sorted[i]->cfp; cfp; cfp=cfp->next){
        if( cfp->status==COMPLETE ) continue;
        for(plp=cfp->fplp; plp; plp=plp->next){
          change = SetUnion(plp->cfp->fws,cfp->fws);
          if( change ){
            plp->cfp->status = INCOMPLETE;
            progress = 1;
	  }
	}
        cfp->status = COMPLETE;
      }
    }
  }while( progress );
}